

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ActivationParametricSoftplus::CopyFrom
          (ActivationParametricSoftplus *this,ActivationParametricSoftplus *from)

{
  if (from != this) {
    if (this->alpha_ != (WeightParams *)0x0) {
      (*(this->alpha_->super_MessageLite)._vptr_MessageLite[1])();
    }
    this->alpha_ = (WeightParams *)0x0;
    if (this->beta_ != (WeightParams *)0x0) {
      (*(this->beta_->super_MessageLite)._vptr_MessageLite[1])();
    }
    this->beta_ = (WeightParams *)0x0;
    MergeFrom(this,from);
    return;
  }
  return;
}

Assistant:

void ActivationParametricSoftplus::CopyFrom(const ActivationParametricSoftplus& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.ActivationParametricSoftplus)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}